

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DisposeIntersectNodes(Clipper *this)

{
  IntersectNode *pIVar1;
  IntersectNode *iNode;
  Clipper *this_local;
  
  while (this->m_IntersectNodes != (IntersectNode *)0x0) {
    pIVar1 = this->m_IntersectNodes->next;
    if (this->m_IntersectNodes != (IntersectNode *)0x0) {
      operator_delete(this->m_IntersectNodes);
    }
    this->m_IntersectNodes = pIVar1;
  }
  return;
}

Assistant:

void Clipper::DisposeIntersectNodes()
{
  while ( m_IntersectNodes )
  {
    IntersectNode* iNode = m_IntersectNodes->next;
    delete m_IntersectNodes;
    m_IntersectNodes = iNode;
  }
}